

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O0

void __thiscall
ON_PhysicallyBasedMaterial::SynchronizeLegacyMaterial(ON_PhysicallyBasedMaterial *this)

{
  ON_Material *pOVar1;
  Impl *pIVar2;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  double extraout_XMM0_Qa_04;
  undefined8 uVar3;
  double local_98;
  ON_4fColor local_80;
  anon_union_4_2_6147a14e_for_ON_Color_15 local_70;
  anon_union_4_2_6147a14e_for_ON_Color_15 local_6c;
  int local_68;
  int bf;
  anon_union_4_2_6147a14e_for_ON_Color_15 local_54;
  ON_4fColor local_50;
  anon_union_4_2_6147a14e_for_ON_Color_15 local_40;
  anon_union_4_2_6147a14e_for_ON_Color_15 local_3c;
  double local_38;
  double reflectivity;
  float local_28 [2];
  anon_union_4_2_6147a14e_for_ON_Color_15 local_20;
  byte local_19;
  ON_Material *pOStack_18;
  bool bIsMetal;
  ON_Material *mat;
  ON_PhysicallyBasedMaterial *this_local;
  
  mat = (ON_Material *)this;
  pIVar2 = Implementation(this);
  pOStack_18 = pIVar2->material;
  (*this->_vptr_ON_PhysicallyBasedMaterial[0xd])();
  pOVar1 = pOStack_18;
  uVar3._0_4_ = 0.0;
  uVar3._4_4_ = 1.75;
  local_19 = 0.5 < extraout_XMM0_Qa;
  if ((bool)local_19) {
    local_20 = ON_Color::Black.field_0;
  }
  else {
    (*this->_vptr_ON_PhysicallyBasedMaterial[5])();
    local_28 = (float  [2])uVar3;
    local_20 = (anon_union_4_2_6147a14e_for_ON_Color_15)
               ON_4fColor::operator_cast_to_ON_Color((ON_4fColor *)&reflectivity);
  }
  ON_Material::SetDiffuse(pOVar1,(ON_Color)local_20);
  if ((local_19 & 1) == 0) {
    (*this->_vptr_ON_PhysicallyBasedMaterial[0x15])();
    local_98 = 1.0 - extraout_XMM0_Qa_00;
  }
  else {
    local_98 = 1.0;
  }
  local_38 = local_98;
  ON_Material::SetFresnelReflections(pOStack_18,(bool)((local_19 ^ 0xff) & 1));
  ON_Material::SetReflectivity(pOStack_18,local_38);
  pOVar1 = pOStack_18;
  (*this->_vptr_ON_PhysicallyBasedMaterial[0x25])();
  ON_Material::SetTransparency(pOVar1,1.0 - extraout_XMM0_Qa_01);
  local_3c = ON_Color::Black.field_0;
  ON_Material::SetAmbient(pOStack_18,ON_Color::Black);
  ON_Material::SetShine(pOStack_18,local_38 * 255.0);
  pOVar1 = pOStack_18;
  if ((local_19 & 1) == 0) {
    local_68 = (int)(local_38 * 255.0);
    ON_Color::ON_Color((ON_Color *)&local_6c,local_68,local_68,local_68);
    ON_Material::SetSpecular(pOVar1,(ON_Color)local_6c);
    (pOStack_18->m_reflection).field_0 = ON_Color::White.field_0;
  }
  else {
    (*this->_vptr_ON_PhysicallyBasedMaterial[5])();
    local_40 = (anon_union_4_2_6147a14e_for_ON_Color_15)
               ON_4fColor::operator_cast_to_ON_Color(&local_50);
    ON_Material::SetSpecular(pOVar1,(ON_Color)local_40);
    (*this->_vptr_ON_PhysicallyBasedMaterial[5])();
    local_54 = (anon_union_4_2_6147a14e_for_ON_Color_15)
               ON_4fColor::operator_cast_to_ON_Color((ON_4fColor *)&stack0xffffffffffffff9c);
    (pOStack_18->m_reflection).field_0 = local_54;
  }
  (*this->_vptr_ON_PhysicallyBasedMaterial[0x15])();
  pOStack_18->m_reflection_glossiness = extraout_XMM0_Qa_02;
  (*this->_vptr_ON_PhysicallyBasedMaterial[0x27])();
  pOVar1 = pOStack_18;
  pOStack_18->m_refraction_glossiness = extraout_XMM0_Qa_03;
  (*this->_vptr_ON_PhysicallyBasedMaterial[0x29])();
  local_70 = (anon_union_4_2_6147a14e_for_ON_Color_15)
             ON_4fColor::operator_cast_to_ON_Color(&local_80);
  ON_Material::SetEmission(pOVar1,(ON_Color)local_70);
  (*this->_vptr_ON_PhysicallyBasedMaterial[0x23])();
  pOStack_18->m_index_of_refraction = extraout_XMM0_Qa_04;
  return;
}

Assistant:

void ON_PhysicallyBasedMaterial::SynchronizeLegacyMaterial(void)
{
  auto& mat = *Implementation().material;

  const bool bIsMetal = Metallic() > 0.5;

  mat.SetDiffuse(bIsMetal ? ON_Color::Black : (ON_Color)BaseColor());

  const double reflectivity = bIsMetal ? 1.0 : 1.0 - Roughness();

  mat.SetFresnelReflections(!bIsMetal);

  mat.SetReflectivity(reflectivity);
  mat.SetTransparency(1.0 - Opacity());
  mat.SetAmbient(ON_Color::Black);

  //Gloss
  mat.SetShine(ON_Material::MaxShine * reflectivity);

  if (bIsMetal)
  {
    mat.SetSpecular(BaseColor());
    mat.m_reflection = BaseColor();
  }
  else
  {
    const int bf = (int)(255.0 * reflectivity);
    mat.SetSpecular(ON_Color(bf, bf, bf));
    mat.m_reflection = ON_Color::White;
  }

  mat.m_reflection_glossiness = Roughness();
  mat.m_refraction_glossiness = OpacityRoughness();

  mat.SetEmission(Emission());

  mat.m_index_of_refraction = OpacityIOR();

  //No need to do the textures, because the ones that are supported are in the right channels already.
}